

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerStep * sqlite3TriggerSelectStep(sqlite3 *db,Select *pSelect)

{
  TriggerStep *pTVar1;
  
  pTVar1 = (TriggerStep *)sqlite3DbMallocZero(db,0x48);
  if (pTVar1 == (TriggerStep *)0x0) {
    if (pSelect != (Select *)0x0) {
      clearSelect(db,pSelect,1);
    }
  }
  else {
    pTVar1->op = 'w';
    pTVar1->orconf = '\n';
    pTVar1->pSelect = pSelect;
  }
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerSelectStep(sqlite3 *db, Select *pSelect){
  TriggerStep *pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep));
  if( pTriggerStep==0 ) {
    sqlite3SelectDelete(db, pSelect);
    return 0;
  }
  pTriggerStep->op = TK_SELECT;
  pTriggerStep->pSelect = pSelect;
  pTriggerStep->orconf = OE_Default;
  return pTriggerStep;
}